

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_ntlm_core.c
# Opt level: O2

CURLcode Curl_ntlm_core_mk_nt_hash(char *password,uchar *ntbuffer)

{
  size_t srclen;
  curl_malloc_callback *pp_Var1;
  uchar *dest;
  CURLcode CVar2;
  char *pcVar3;
  
  srclen = strlen(password);
  CVar2 = CURLE_OUT_OF_MEMORY;
  if (-1 < (long)srclen) {
    if (srclen == 0) {
      pcVar3 = "";
      pp_Var1 = (curl_malloc_callback *)&Curl_cstrdup;
    }
    else {
      pp_Var1 = &Curl_cmalloc;
      pcVar3 = (char *)(srclen * 2);
    }
    dest = (uchar *)(**pp_Var1)(pcVar3);
    if (dest != (uchar *)0x0) {
      ascii_to_unicode_le(dest,password,srclen);
      Curl_md4it(ntbuffer,dest,srclen * 2);
      ntbuffer[0x14] = '\0';
      ntbuffer[0x10] = '\0';
      ntbuffer[0x11] = '\0';
      ntbuffer[0x12] = '\0';
      ntbuffer[0x13] = '\0';
      (*Curl_cfree)(dest);
      CVar2 = CURLE_OK;
    }
  }
  return CVar2;
}

Assistant:

CURLcode Curl_ntlm_core_mk_nt_hash(const char *password,
                                   unsigned char *ntbuffer /* 21 bytes */)
{
  size_t len = strlen(password);
  unsigned char *pw;
  if(len > SIZE_T_MAX/2) /* avoid integer overflow */
    return CURLE_OUT_OF_MEMORY;
  pw = len ? malloc(len * 2) : (unsigned char *)strdup("");
  if(!pw)
    return CURLE_OUT_OF_MEMORY;

  ascii_to_unicode_le(pw, password, len);

  /* Create NT hashed password. */
  Curl_md4it(ntbuffer, pw, 2 * len);
  memset(ntbuffer + 16, 0, 21 - 16);

  free(pw);

  return CURLE_OK;
}